

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void SetWindowState(uint flags)

{
  uint flags_local;
  
  if (((CORE.Window.flags & 0x40) != (flags & 0x40)) && ((flags & 0x40) != 0)) {
    glfwSwapInterval(1);
    CORE.Window.flags = CORE.Window.flags | 0x40;
  }
  if ((CORE.Window.flags & 2) != (flags & 2)) {
    ToggleFullscreen();
  }
  if (((CORE.Window.flags & 4) != (flags & 4)) && ((flags & 4) != 0)) {
    glfwSetWindowAttrib(CORE.Window.handle,0x20003,1);
    CORE.Window.flags = CORE.Window.flags | 4;
  }
  if (((CORE.Window.flags & 8) != (flags & 8)) && ((flags & 8) != 0)) {
    glfwSetWindowAttrib(CORE.Window.handle,0x20005,0);
    CORE.Window.flags = CORE.Window.flags | 8;
  }
  if (((CORE.Window.flags & 0x80) != (flags & 0x80)) && ((flags & 0x80) != 0)) {
    glfwHideWindow(CORE.Window.handle);
    CORE.Window.flags = CORE.Window.flags | 0x80;
  }
  if (((CORE.Window.flags & 0x200) != (flags & 0x200)) && ((flags & 0x200) != 0)) {
    MinimizeWindow();
  }
  if (((CORE.Window.flags & 0x400) != (flags & 0x400)) && ((flags & 0x400) != 0)) {
    MaximizeWindow();
  }
  if (((CORE.Window.flags & 0x800) != (flags & 0x800)) && ((flags & 0x800) != 0)) {
    glfwSetWindowAttrib(CORE.Window.handle,0x2000c,0);
    CORE.Window.flags = CORE.Window.flags | 0x800;
  }
  if (((CORE.Window.flags & 0x1000) != (flags & 0x1000)) && ((flags & 0x1000) != 0)) {
    glfwSetWindowAttrib(CORE.Window.handle,0x20007,1);
    CORE.Window.flags = CORE.Window.flags | 0x1000;
  }
  if (((CORE.Window.flags & 0x100) != (flags & 0x100)) && ((flags & 0x100) != 0)) {
    CORE.Window.flags = CORE.Window.flags | 0x100;
  }
  if (((CORE.Window.flags & 0x10) != (flags & 0x10)) && ((flags & 0x10) != 0)) {
    TraceLog(4,
             "WINDOW: Framebuffer transparency can only by configured before window initialization")
    ;
  }
  if (((CORE.Window.flags & 0x2000) != (flags & 0x2000)) && ((flags & 0x2000) != 0)) {
    TraceLog(4,"WINDOW: High DPI can only by configured before window initialization");
  }
  if (((CORE.Window.flags & 0x20) != (flags & 0x20)) && ((flags & 0x20) != 0)) {
    TraceLog(4,"WINDOW: MSAA can only by configured before window initialization");
  }
  if (((CORE.Window.flags & 0x10000) != (flags & 0x10000)) && ((flags & 0x10000) != 0)) {
    TraceLog(4,"RPI: Interlaced mode can only by configured before window initialization");
  }
  return;
}

Assistant:

void SetWindowState(unsigned int flags)
{
#if defined(PLATFORM_DESKTOP)
    // Check previous state and requested state to apply required changes
    // NOTE: In most cases the functions already change the flags internally

    // State change: FLAG_VSYNC_HINT
    if (((CORE.Window.flags & FLAG_VSYNC_HINT) != (flags & FLAG_VSYNC_HINT)) && ((flags & FLAG_VSYNC_HINT) > 0))
    {
        glfwSwapInterval(1);
        CORE.Window.flags |= FLAG_VSYNC_HINT;
    }

    // State change: FLAG_FULLSCREEN_MODE
    if ((CORE.Window.flags & FLAG_FULLSCREEN_MODE) != (flags & FLAG_FULLSCREEN_MODE))
    {
        ToggleFullscreen();     // NOTE: Window state flag updated inside function
    }

    // State change: FLAG_WINDOW_RESIZABLE
    if (((CORE.Window.flags & FLAG_WINDOW_RESIZABLE) != (flags & FLAG_WINDOW_RESIZABLE)) && ((flags & FLAG_WINDOW_RESIZABLE) > 0))
    {
        glfwSetWindowAttrib(CORE.Window.handle, GLFW_RESIZABLE, GLFW_TRUE);
        CORE.Window.flags |= FLAG_WINDOW_RESIZABLE;
    }

    // State change: FLAG_WINDOW_UNDECORATED
    if (((CORE.Window.flags & FLAG_WINDOW_UNDECORATED) != (flags & FLAG_WINDOW_UNDECORATED)) && (flags & FLAG_WINDOW_UNDECORATED))
    {
        glfwSetWindowAttrib(CORE.Window.handle, GLFW_DECORATED, GLFW_FALSE);
        CORE.Window.flags |= FLAG_WINDOW_UNDECORATED;
    }

    // State change: FLAG_WINDOW_HIDDEN
    if (((CORE.Window.flags & FLAG_WINDOW_HIDDEN) != (flags & FLAG_WINDOW_HIDDEN)) && ((flags & FLAG_WINDOW_HIDDEN) > 0))
    {
        glfwHideWindow(CORE.Window.handle);
        CORE.Window.flags |= FLAG_WINDOW_HIDDEN;
    }

    // State change: FLAG_WINDOW_MINIMIZED
    if (((CORE.Window.flags & FLAG_WINDOW_MINIMIZED) != (flags & FLAG_WINDOW_MINIMIZED)) && ((flags & FLAG_WINDOW_MINIMIZED) > 0))
    {
        //GLFW_ICONIFIED
        MinimizeWindow();       // NOTE: Window state flag updated inside function
    }

    // State change: FLAG_WINDOW_MAXIMIZED
    if (((CORE.Window.flags & FLAG_WINDOW_MAXIMIZED) != (flags & FLAG_WINDOW_MAXIMIZED)) && ((flags & FLAG_WINDOW_MAXIMIZED) > 0))
    {
        //GLFW_MAXIMIZED
        MaximizeWindow();       // NOTE: Window state flag updated inside function
    }

    // State change: FLAG_WINDOW_UNFOCUSED
    if (((CORE.Window.flags & FLAG_WINDOW_UNFOCUSED) != (flags & FLAG_WINDOW_UNFOCUSED)) && ((flags & FLAG_WINDOW_UNFOCUSED) > 0))
    {
        glfwSetWindowAttrib(CORE.Window.handle, GLFW_FOCUS_ON_SHOW, GLFW_FALSE);
        CORE.Window.flags |= FLAG_WINDOW_UNFOCUSED;
    }

    // State change: FLAG_WINDOW_TOPMOST
    if (((CORE.Window.flags & FLAG_WINDOW_TOPMOST) != (flags & FLAG_WINDOW_TOPMOST)) && ((flags & FLAG_WINDOW_TOPMOST) > 0))
    {
        glfwSetWindowAttrib(CORE.Window.handle, GLFW_FLOATING, GLFW_TRUE);
        CORE.Window.flags |= FLAG_WINDOW_TOPMOST;
    }

    // State change: FLAG_WINDOW_ALWAYS_RUN
    if (((CORE.Window.flags & FLAG_WINDOW_ALWAYS_RUN) != (flags & FLAG_WINDOW_ALWAYS_RUN)) && ((flags & FLAG_WINDOW_ALWAYS_RUN) > 0))
    {
        CORE.Window.flags |= FLAG_WINDOW_ALWAYS_RUN;
    }

    // The following states can not be changed after window creation

    // State change: FLAG_WINDOW_TRANSPARENT
    if (((CORE.Window.flags & FLAG_WINDOW_TRANSPARENT) != (flags & FLAG_WINDOW_TRANSPARENT)) && ((flags & FLAG_WINDOW_TRANSPARENT) > 0))
    {
        TRACELOG(LOG_WARNING, "WINDOW: Framebuffer transparency can only by configured before window initialization");
    }

    // State change: FLAG_WINDOW_HIGHDPI
    if (((CORE.Window.flags & FLAG_WINDOW_HIGHDPI) != (flags & FLAG_WINDOW_HIGHDPI)) && ((flags & FLAG_WINDOW_HIGHDPI) > 0))
    {
        TRACELOG(LOG_WARNING, "WINDOW: High DPI can only by configured before window initialization");
    }

    // State change: FLAG_MSAA_4X_HINT
    if (((CORE.Window.flags & FLAG_MSAA_4X_HINT) != (flags & FLAG_MSAA_4X_HINT)) && ((flags & FLAG_MSAA_4X_HINT) > 0))
    {
        TRACELOG(LOG_WARNING, "WINDOW: MSAA can only by configured before window initialization");
    }

    // State change: FLAG_INTERLACED_HINT
    if (((CORE.Window.flags & FLAG_INTERLACED_HINT) != (flags & FLAG_INTERLACED_HINT)) && ((flags & FLAG_INTERLACED_HINT) > 0))
    {
        TRACELOG(LOG_WARNING, "RPI: Interlaced mode can only by configured before window initialization");
    }
#endif
}